

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivateContainer::updateStyleSettings(QComboBoxPrivateContainer *this)

{
  QWidget *this_00;
  int iVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  bool on;
  QStyleOptionComboBox opt;
  QStyleOptionComboBox local_b0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b0,0xaa,0x90);
  comboStyleOption(&local_b0,this);
  this_00 = (QWidget *)this->view;
  pQVar2 = QWidget::style(&this->combo->super_QWidget);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x13,&local_b0,this->combo,0);
  on = true;
  if (iVar1 == 0) {
    pQVar2 = QWidget::style(&this->combo->super_QWidget);
    iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x19,&local_b0,this->combo,0);
    on = iVar1 != 0;
  }
  QWidget::setAttribute(this_00,WA_MouseTracking,on);
  pQVar2 = QWidget::style(&this->combo->super_QWidget);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x45,&local_b0,this->combo,0);
  QFrame::setFrameStyle(&this->super_QFrame,iVar1);
  updateTopBottomMargin(this);
  QIcon::~QIcon(&local_b0.currentIcon);
  if (&(local_b0.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_b0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_b0.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::updateStyleSettings()
{
    // add scroller arrows if style needs them
    QStyleOptionComboBox opt = comboStyleOption();
    view->setMouseTracking(combo->style()->styleHint(QStyle::SH_ComboBox_ListMouseTracking, &opt, combo) ||
                           combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo));
    setFrameStyle(combo->style()->styleHint(QStyle::SH_ComboBox_PopupFrameStyle, &opt, combo));
    updateTopBottomMargin();
}